

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharSet.cpp
# Opt level: O0

void __thiscall
UnifiedRegex::CharBitvec::ToEquivClass<char16_t>
          (CharBitvec *this,ArenaAllocator *allocator,uint base,uint *tblidx,
          CharSet<char16_t> *result,codepoint_t baseOffset)

{
  Char lc;
  code *pcVar1;
  bool bVar2;
  Char hc;
  int iVar3;
  int iVar4;
  undefined4 *puVar5;
  int local_58;
  int i;
  uint n;
  char16_t equivl [4];
  uint acth;
  uint h;
  uint l;
  int li;
  int hi;
  codepoint_t baseOffset_local;
  CharSet<char16_t> *result_local;
  uint *tblidx_local;
  uint base_local;
  ArenaAllocator *allocator_local;
  CharBitvec *this_local;
  
  l = 0xffffffff;
  do {
    iVar3 = NextSet(this,l + 1);
    if (iVar3 < 0) {
      return;
    }
    iVar4 = NextClear(this,iVar3 + 1);
    if (iVar4 < 0) {
      l = 0xff;
    }
    else {
      if (iVar4 < 1) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar5 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/CharSet.cpp"
                           ,0xa9,"(hi > 0)","hi > 0");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar5 = 0;
      }
      l = iVar4 - 1;
    }
    acth = base + iVar3 + baseOffset;
    equivl._4_4_ = base + l + baseOffset;
    do {
      CaseInsensitive::RangeToEquivClass(tblidx,acth,equivl._4_4_,(uint *)equivl,(char16 *)&i);
      iVar3 = equivl._0_4_ - acth;
      for (local_58 = 0; local_58 < 4; local_58 = local_58 + 1) {
        lc = *(Char *)((long)&i + (long)local_58 * 2);
        hc = Chars<char16_t>::Shift(*(Char *)((long)&i + (long)local_58 * 2),iVar3);
        CharSet<char16_t>::SetRange(result,allocator,lc,hc);
      }
      acth = equivl._0_4_ + 1;
    } while (acth <= (uint)equivl._4_4_);
  } while( true );
}

Assistant:

void CharBitvec::ToEquivClass(ArenaAllocator* allocator, uint base, uint& tblidx, CharSet<C>& result, codepoint_t baseOffset) const
    {
        int hi = -1;
        while (true)
        {
            // Find the next range of set bits in vector
            int li = NextSet(hi + 1);
            if (li < 0)
                return;
            hi = NextClear(li + 1);
            if (hi < 0)
                hi = Size - 1;
            else
            {
                Assert(hi > 0);
                hi--;
            }

            // Convert to character codes
            uint l = base + li + baseOffset;
            uint h = base + hi + baseOffset;

            do
            {
                uint acth;
                C equivl[CaseInsensitive::EquivClassSize];
                CaseInsensitive::RangeToEquivClass(tblidx, l, h, acth, equivl);
                uint n = acth - l;
                for (int i = 0; i < CaseInsensitive::EquivClassSize; i++)
                {
                    result.SetRange(allocator, equivl[i], Chars<C>::Shift(equivl[i], n));
                }

                // Go around again for rest of this range
                l = acth + 1;
            }
            while (l <= h);
        }
    }